

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celu.cpp
# Opt level: O1

int __thiscall ncnn::CELU::forward_inplace(CELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  void *pvVar8;
  float fVar9;
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    pvVar8 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->cstep;
    sVar4 = bottom_top_blob->elemsize;
    lVar7 = 0;
    do {
      if (0 < (int)uVar5) {
        uVar6 = 0;
        do {
          fVar9 = *(float *)((long)pvVar8 + uVar6 * 4);
          if (fVar9 < 0.0) {
            fVar1 = this->alpha;
            fVar9 = expf(fVar9 / fVar1);
            *(float *)((long)pvVar8 + uVar6 * 4) = (fVar9 + -1.0) * fVar1;
          }
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      lVar7 = lVar7 + 1;
      pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar4);
    } while (lVar7 != iVar2);
  }
  return 0;
}

Assistant:

int CELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = (expf(ptr[i] / alpha) - 1.f) * alpha;
        }
    }

    return 0;
}